

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O2

FT_Error FT_Outline_Render(FT_Library library,FT_Outline *outline,FT_Raster_Params *params)

{
  int iVar1;
  FT_Renderer_conflict pFVar2;
  FT_ListNode node;
  FT_BBox cbox;
  
  if (library == (FT_Library)0x0) {
    iVar1 = 0x21;
  }
  else {
    iVar1 = 0x14;
    if (outline != (FT_Outline *)0x0) {
      if (params == (FT_Raster_Params *)0x0) {
        iVar1 = 6;
      }
      else {
        FT_Outline_Get_CBox(outline,&cbox);
        if ((cbox.yMax < 0x1000001 && cbox.xMax < 0x1000001) &&
            (-0x1000001 < cbox.yMin && -0x1000001 < cbox.xMin)) {
          node = (library->renderers).head;
          pFVar2 = library->cur_renderer;
          params->source = outline;
          if ((params->flags & 6U) == 2) {
            (params->clip_box).xMin = cbox.xMin >> 6;
            (params->clip_box).yMin = cbox.yMin >> 6;
            (params->clip_box).xMax = cbox.xMax + 0x3f >> 6;
            (params->clip_box).yMax = cbox.yMax + 0x3f >> 6;
          }
          iVar1 = 0x13;
          while (pFVar2 != (FT_Renderer_conflict)0x0) {
            iVar1 = (*pFVar2->raster_render)(pFVar2->raster,params);
            if (iVar1 == 0) {
              return 0;
            }
            if ((char)iVar1 != '\x13') {
              return iVar1;
            }
            pFVar2 = FT_Lookup_Renderer(library,FT_GLYPH_FORMAT_OUTLINE,&node);
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Outline_Render( FT_Library         library,
                     FT_Outline*        outline,
                     FT_Raster_Params*  params )
  {
    FT_Error     error;
    FT_Renderer  renderer;
    FT_ListNode  node;
    FT_BBox      cbox;


    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !outline )
      return FT_THROW( Invalid_Outline );

    if ( !params )
      return FT_THROW( Invalid_Argument );

    FT_Outline_Get_CBox( outline, &cbox );
    if ( cbox.xMin < -0x1000000L || cbox.yMin < -0x1000000L ||
         cbox.xMax >  0x1000000L || cbox.yMax >  0x1000000L )
      return FT_THROW( Invalid_Outline );

    renderer = library->cur_renderer;
    node     = library->renderers.head;

    params->source = (void*)outline;

    /* preset clip_box for direct mode */
    if ( params->flags & FT_RASTER_FLAG_DIRECT    &&
         !( params->flags & FT_RASTER_FLAG_CLIP ) )
    {
      params->clip_box.xMin = cbox.xMin >> 6;
      params->clip_box.yMin = cbox.yMin >> 6;
      params->clip_box.xMax = ( cbox.xMax + 63 ) >> 6;
      params->clip_box.yMax = ( cbox.yMax + 63 ) >> 6;
    }

    error = FT_ERR( Cannot_Render_Glyph );
    while ( renderer )
    {
      error = renderer->raster_render( renderer->raster, params );
      if ( !error || FT_ERR_NEQ( error, Cannot_Render_Glyph ) )
        break;

      /* FT_Err_Cannot_Render_Glyph is returned if the render mode   */
      /* is unsupported by the current renderer for this glyph image */
      /* format                                                      */

      /* now, look for another renderer that supports the same */
      /* format                                                */
      renderer = FT_Lookup_Renderer( library, FT_GLYPH_FORMAT_OUTLINE,
                                     &node );
    }

    return error;
  }